

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

int traverseCclosure(global_State *g,CClosure *cl)

{
  int local_1c;
  int i;
  CClosure *cl_local;
  global_State *g_local;
  
  local_1c = 0;
  do {
    if ((int)(uint)cl->nupvalues <= local_1c) {
      return cl->nupvalues + 1;
    }
    if ((cl->upvalue[local_1c].tt_ & 0x8000) != 0) {
      if ((cl->upvalue[local_1c].tt_ & 0x8000) == 0) {
        __assert_fail("(((&cl->upvalue[i])->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x2a4,"int traverseCclosure(global_State *, CClosure *)");
      }
      if ((cl->upvalue[local_1c].tt_ & 0x7f) != (ushort)(cl->upvalue[local_1c].value_.gc)->tt) {
LAB_0012b96c:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x2a4,"int traverseCclosure(global_State *, CClosure *)");
      }
      if (g->mainthread != (lua_State *)0x0) {
        if ((cl->upvalue[local_1c].tt_ & 0x8000) == 0) {
          __assert_fail("(((&cl->upvalue[i])->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x2a4,"int traverseCclosure(global_State *, CClosure *)");
        }
        if (((cl->upvalue[local_1c].value_.gc)->marked & (g->mainthread->l_G->currentwhite ^ 0x18))
            != 0) goto LAB_0012b96c;
      }
    }
    if ((cl->upvalue[local_1c].tt_ & 0x8000) != 0) {
      if ((cl->upvalue[local_1c].tt_ & 0x8000) == 0) {
        __assert_fail("(((&cl->upvalue[i])->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x2a4,"int traverseCclosure(global_State *, CClosure *)");
      }
      if (((cl->upvalue[local_1c].value_.gc)->marked & 0x18) != 0) {
        if ((cl->upvalue[local_1c].tt_ & 0x8000) == 0) {
          __assert_fail("(((&cl->upvalue[i])->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x2a4,"int traverseCclosure(global_State *, CClosure *)");
        }
        reallymarkobject(g,cl->upvalue[local_1c].value_.gc);
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static int traverseCclosure (global_State *g, CClosure *cl) {
  int i;
  for (i = 0; i < cl->nupvalues; i++)  /* mark its upvalues */
    markvalue(g, &cl->upvalue[i]);
  return 1 + cl->nupvalues;
}